

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void declareVariable(void)

{
  Token name_00;
  _Bool _Var1;
  Local *local;
  int i;
  Token *name;
  Token *in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffe0;
  Local *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  int iVar2;
  
  if (current->scopeDepth != 0) {
    iVar2 = current->localCount;
    while ((iVar2 = iVar2 + -1, -1 < iVar2 &&
           ((in_stack_ffffffffffffffe8 = current->locals + iVar2,
            in_stack_ffffffffffffffe8->depth == -1 ||
            (current->scopeDepth <= in_stack_ffffffffffffffe8->depth))))) {
      _Var1 = identifiersEqual(in_stack_ffffffffffffffc8,(Token *)0x107543);
      if (_Var1) {
        error((char *)0x107555);
      }
    }
    name_00.start = (char *)in_stack_ffffffffffffffe8;
    name_00._0_8_ = in_stack_ffffffffffffffe0;
    name_00.length = in_stack_fffffffffffffff0;
    name_00.line = iVar2;
    addLocal(name_00);
  }
  return;
}

Assistant:

static void declareVariable() {
    // Global variables are implicitly declared.
    if (current->scopeDepth == 0) {
        return;
    }

    Token *name = &parser.previous;

    /**
     * Current scope is on the end of array so we looking backwards
     * until we stop on the first element -> the global scope
     */
    for (int i = current->localCount - 1; i >= 0; i--) {
        Local *local = &current->locals[i];
        if (local->depth != -1 && local->depth < current->scopeDepth) {
            break;
        }

        //Check if this variable is declared in same scope twice
        if (identifiersEqual(name, &local->name)) {
            error("Variable with this name already declared in this scope.");
        }
    }
    addLocal(*name);
}